

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

optional<google::protobuf::internal::DescriptorNames> __thiscall
google::protobuf::anon_unknown_24::
FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
::AllocateEntityNames
          (FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
           *this,string_view scope,string_view name)

{
  size_type sVar1;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> bytes;
  _Optional_base<google::protobuf::internal::DescriptorNames,_true,_true> _Var2;
  initializer_list<unsigned_long> sizes;
  size_t local_50;
  size_t local_48;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  string_view local_30;
  size_t local_20;
  char *local_18;
  string_view local_10;
  
  local_50 = name._M_len;
  local_40._M_len = scope._M_len;
  if (local_40._M_len == 0) {
    local_30 = AllocatePlaceholderNames::kNullChar;
    sVar1 = 2;
    local_48 = local_50;
    local_40._M_len = local_50;
    local_40._M_str = name._M_str;
  }
  else {
    local_30._M_str = ".";
    local_30._M_len = 1;
    local_10 = AllocatePlaceholderNames::kNullChar;
    local_48 = local_40._M_len + 1 + local_50;
    sVar1 = 4;
    local_40._M_str = scope._M_str;
    local_20 = local_50;
    local_18 = name._M_str;
  }
  bytes._M_array = &local_40;
  sizes._M_array = &local_50;
  bytes._M_len = sVar1;
  sizes._M_len = 2;
  _Var2._M_payload.super__Optional_payload_base<google::protobuf::internal::DescriptorNames> =
       (_Optional_payload<google::protobuf::internal::DescriptorNames,_true,_true,_true>)
       CreateDescriptorNames(this,bytes,sizes);
  return (_Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>)
         (_Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>)
         _Var2._M_payload.super__Optional_payload_base<google::protobuf::internal::DescriptorNames>;
}

Assistant:

std::optional<internal::DescriptorNames> AllocateEntityNames(
      absl::string_view scope, absl::string_view name) {
    static constexpr absl::string_view kNullChar("\0", 1);
    if (scope.empty()) {
      return CreateDescriptorNames({name, kNullChar},
                                   {name.size(), name.size()});
    } else {
      return CreateDescriptorNames(
          {scope, ".", name, kNullChar},
          {name.size(), scope.size() + 1 + name.size()});
    }
  }